

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS
ref_node_tri_epic_dquality_dnode0
          (REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  uint uVar1;
  double dVar2;
  double local_1a8;
  double local_198;
  double local_190;
  double local_188;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL m [6];
  int local_11c;
  REF_INT i;
  REF_DBL d_l1 [3];
  REF_DBL local_f8;
  REF_DBL d_l0 [3];
  REF_DBL RStack_d8;
  REF_DBL d_denom [3];
  REF_DBL denom;
  REF_DBL d_num [3];
  REF_DBL num;
  REF_DBL d_area_in_metric [3];
  REF_DBL area_in_metric;
  REF_DBL d_area [3];
  REF_DBL area;
  REF_DBL min_det;
  REF_DBL det;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL *d_quality_local;
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  l0 = (REF_DBL)d_quality;
  d_quality_local = quality;
  quality_local = (REF_DBL *)nodes;
  nodes_local = &ref_node->n;
  uVar1 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],&l1,&local_f8);
  if (uVar1 == 0) {
    uVar1 = ref_node_dratio_dnode0
                      ((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                       *(REF_INT *)(quality_local + 1),&l2,(REF_DBL *)&stack0xfffffffffffffee8);
    if (uVar1 == 0) {
      uVar1 = ref_node_ratio((REF_NODE)nodes_local,*(REF_INT *)((long)quality_local + 4),
                             *(REF_INT *)(quality_local + 1),&det);
      if (uVar1 == 0) {
        uVar1 = ref_node_tri_darea_dnode0
                          ((REF_NODE)nodes_local,(REF_INT *)quality_local,d_area + 2,&area_in_metric
                          );
        if (uVar1 == 0) {
          uVar1 = ref_node_metric_get((REF_NODE)nodes_local,*(REF_INT *)quality_local,
                                      (REF_DBL *)&ref_private_macro_code_rss_1);
          if (uVar1 == 0) {
            uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
            local_188 = min_det;
            if (uVar1 == 0) {
              uVar1 = ref_node_metric_get((REF_NODE)nodes_local,
                                          *(REF_INT *)((long)quality_local + 4),
                                          (REF_DBL *)&ref_private_macro_code_rss_1);
              if (uVar1 == 0) {
                uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                if (uVar1 == 0) {
                  if (min_det <= local_188) {
                    local_188 = min_det;
                  }
                  else {
                  }
                  uVar1 = ref_node_metric_get((REF_NODE)nodes_local,*(REF_INT *)(quality_local + 1),
                                              (REF_DBL *)&ref_private_macro_code_rss_1);
                  if (uVar1 == 0) {
                    uVar1 = ref_matrix_det_m((REF_DBL *)&ref_private_macro_code_rss_1,&min_det);
                    if (uVar1 == 0) {
                      if (min_det <= local_188) {
                        local_190 = min_det;
                      }
                      else {
                        local_190 = local_188;
                      }
                      dVar2 = pow(local_190,0.3333333333333333);
                      d_area_in_metric[2] = dVar2 * d_area[2];
                      for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
                        dVar2 = pow(local_190,0.3333333333333333);
                        d_area_in_metric[(long)local_11c + -1] =
                             dVar2 * d_area[(long)local_11c + -1];
                      }
                      d_num[2] = d_area_in_metric[2];
                      for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
                        d_num[(long)local_11c + -1] = d_area_in_metric[(long)local_11c + -1];
                      }
                      d_denom[2] = det * det + l1 * l1 + l2 * l2;
                      for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
                        d_denom[(long)local_11c + -1] =
                             l1 * 2.0 * d_l0[(long)local_11c + -1] +
                             l2 * 2.0 * *(double *)(&stack0xfffffffffffffee8 + (long)local_11c * 8);
                      }
                      if (d_denom[2] * 1e+20 <= 0.0) {
                        local_198 = -(d_denom[2] * 1e+20);
                      }
                      else {
                        local_198 = d_denom[2] * 1e+20;
                      }
                      if (d_area_in_metric[2] <= 0.0) {
                        local_1a8 = -d_area_in_metric[2];
                      }
                      else {
                        local_1a8 = d_area_in_metric[2];
                      }
                      if (local_198 <= local_1a8) {
                        *d_quality_local = -1.0;
                        for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
                          *(undefined8 *)((long)l0 + (long)local_11c * 8) = 0;
                        }
                      }
                      else {
                        dVar2 = sqrt(3.0);
                        *d_quality_local = ((4.0 / dVar2) * 3.0 * d_num[2]) / d_denom[2];
                        for (local_11c = 0; local_11c < 3; local_11c = local_11c + 1) {
                          dVar2 = sqrt(3.0);
                          *(double *)((long)l0 + (long)local_11c * 8) =
                               (((4.0 / dVar2) * 3.0 *
                                (d_num[(long)local_11c + -1] * d_denom[2] +
                                -(d_num[2] * d_denom[(long)local_11c + -1]))) / d_denom[2]) /
                               d_denom[2];
                        }
                      }
                      ref_node_local._4_4_ = 0;
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x82b,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"n2");
                      ref_node_local._4_4_ = uVar1;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x82a,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"nodes[2] m");
                    ref_node_local._4_4_ = uVar1;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x827,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"n1");
                  ref_node_local._4_4_ = uVar1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x826,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"nodes[1] m");
                ref_node_local._4_4_ = uVar1;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x823,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"n0");
              ref_node_local._4_4_ = uVar1;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x822,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"nodes[0] m");
            ref_node_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x820,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"area");
          ref_node_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x81e,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"l2");
        ref_node_local._4_4_ = uVar1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x81d,
             "ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"l1");
      ref_node_local._4_4_ = uVar1;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x81c,
           "ref_node_tri_epic_dquality_dnode0",(ulong)uVar1,"l0");
    ref_node_local._4_4_ = uVar1;
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tri_epic_dquality_dnode0(
    REF_NODE ref_node, REF_INT *nodes, REF_DBL *quality, REF_DBL *d_quality) {
  REF_DBL l0, l1, l2;

  REF_DBL det, min_det, area, d_area[3];
  REF_DBL area_in_metric, d_area_in_metric[3];
  REF_DBL num, d_num[3], denom, d_denom[3];
  REF_DBL d_l0[3], d_l1[3];
  REF_INT i;
  REF_DBL m[6];

  RSS(ref_node_dratio_dnode0(ref_node, nodes[0], nodes[1], &l0, d_l0), "l0");
  RSS(ref_node_dratio_dnode0(ref_node, nodes[0], nodes[2], &l1, d_l1), "l1");
  RSS(ref_node_ratio(ref_node, nodes[1], nodes[2], &l2), "l2");

  RSS(ref_node_tri_darea_dnode0(ref_node, nodes, &area, d_area), "area");

  RSS(ref_node_metric_get(ref_node, nodes[0], m), "nodes[0] m");
  RSS(ref_matrix_det_m(m, &det), "n0");
  min_det = det;

  RSS(ref_node_metric_get(ref_node, nodes[1], m), "nodes[1] m");
  RSS(ref_matrix_det_m(m, &det), "n1");
  min_det = MIN(min_det, det);

  RSS(ref_node_metric_get(ref_node, nodes[2], m), "nodes[2] m");
  RSS(ref_matrix_det_m(m, &det), "n2");
  min_det = MIN(min_det, det);

  area_in_metric = pow(min_det, 1.0 / 3.0) * area;
  for (i = 0; i < 3; i++)
    d_area_in_metric[i] = pow(min_det, 1.0 / 3.0) * d_area[i];

  num = area_in_metric;
  for (i = 0; i < 3; i++) d_num[i] = d_area_in_metric[i];
  denom = l0 * l0 + l1 * l1 + l2 * l2;
  for (i = 0; i < 3; i++) d_denom[i] = 2.0 * l0 * d_l0[i] + 2.0 * l1 * d_l1[i];

  if (ref_math_divisible(num, denom)) {
    *quality = 4.0 / sqrt(3.0) * 3 * num / denom;
    for (i = 0; i < 3; i++)
      d_quality[i] = 4.0 / sqrt(3.0) * 3 *
                     (d_num[i] * denom - num * d_denom[i]) / denom / denom;
  } else {
    /* printf("%s: %d: %s: div zero area %.18e min_det %.18e (%.18e / %.18e)\n",
       __FILE__, __LINE__, __func__, area, min_det, num, denom); */
    *quality = -1.0;
    for (i = 0; i < 3; i++) d_quality[i] = 0.0;
  }

  return REF_SUCCESS;
}